

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Matchers::Floating::WithinUlpsMatcher::WithinUlpsMatcher
          (WithinUlpsMatcher *this,double target,uint64_t ulps,FloatingPointKind baseType)

{
  ulong uVar1;
  uint uVar2;
  undefined1 in_DL;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  ReusableStringStream *in_stack_ffffffffffffff78;
  MatcherBase<double> *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffffa0;
  ReusableStringStream *in_stack_ffffffffffffffb0;
  
  Impl::MatcherBase<double>::MatcherBase(in_stack_ffffffffffffff80);
  *in_RDI = &PTR__WithinUlpsMatcher_00549f70;
  in_RDI[5] = &DAT_00549fa0;
  in_RDI[6] = in_XMM0_Qa;
  in_RDI[7] = in_RSI;
  *(undefined1 *)(in_RDI + 8) = in_DL;
  if (*(char *)(in_RDI + 8) != '\x01') {
    uVar1 = in_RDI[7];
    uVar2 = clara::std::numeric_limits<unsigned_int>::max();
    if (uVar2 <= uVar1) {
      ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffffb0);
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_ffffffffffffff80,
                 (char (*) [57])in_stack_ffffffffffffff78);
      ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff78);
      throw_domain_error(in_stack_ffffffffffffffa0);
    }
  }
  return;
}

Assistant:

WithinUlpsMatcher::WithinUlpsMatcher(double target, uint64_t ulps, FloatingPointKind baseType)
        :m_target{ target }, m_ulps{ ulps }, m_type{ baseType } {
        CATCH_ENFORCE(m_type == FloatingPointKind::Double
                   || m_ulps < (std::numeric_limits<uint32_t>::max)(),
            "Provided ULP is impossibly large for a float comparison.");
    }